

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

bool __thiscall DataRefs::ToggleLabelDraw(DataRefs *this)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  
  if (this->lastVREnabled == true) {
    bVar1 = *(byte *)&this->labelShown >> 2 & 1;
    bVar3 = (*(byte *)&this->labelShown & 0xfb | bVar1 * '\x04') ^ 4;
  }
  else {
    bVar2 = IsViewExternal(this);
    bVar3 = *(byte *)&this->labelShown;
    if (bVar2) {
      bVar1 = bVar3 & 1;
      bVar3 = bVar3 ^ 1;
    }
    else {
      bVar1 = bVar3 >> 1 & 1;
      bVar3 = (bVar3 & 0xfd | bVar1 * '\x02') ^ 2;
    }
  }
  *(byte *)&this->labelShown = bVar3;
  return bVar1 == 0;
}

Assistant:

bool DataRefs::ToggleLabelDraw()
{
    // Situation = VR?
    if (IsVREnabled())
        return (labelShown.bVR = !labelShown.bVR);
    // Situation = External View?
    if (IsViewExternal())
        return (labelShown.bExternal = !labelShown.bExternal);
    // Situation = Internal View
    else
        return (labelShown.bInternal = !labelShown.bInternal);
}